

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_parser.tab.cc
# Opt level: O0

MC_Parser * __thiscall MC::MC_Parser::yysyntax_error__abi_cxx11_(MC_Parser *this,context *yyctx)

{
  symbol_kind_type *psVar1;
  context *in_RDX;
  MC_Driver *local_60;
  char *yyp;
  ptrdiff_t yyi;
  char *local_48;
  char *yyformat;
  symbol_kind_type local_38;
  int yycount;
  symbol_kind_type yyarg [5];
  context *yyctx_local;
  MC_Parser *this_local;
  string *yyres;
  
  yyformat._4_4_ = yy_syntax_error_arguments_((MC_Parser *)yyctx,in_RDX,&local_38,5);
  switch(yyformat._4_4_) {
  default:
    local_48 = "syntax error";
    break;
  case 1:
    local_48 = "syntax error, unexpected %s";
    break;
  case 2:
    local_48 = "syntax error, unexpected %s, expecting %s";
    break;
  case 3:
    local_48 = "syntax error, unexpected %s, expecting %s or %s";
    break;
  case 4:
    local_48 = "syntax error, unexpected %s, expecting %s or %s or %s";
    break;
  case 5:
    local_48 = "syntax error, unexpected %s, expecting %s or %s or %s or %s";
  }
  yyi._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  yyp = (char *)0x0;
  local_60 = (MC_Driver *)local_48;
  while ((((basic_symbol<MC::MC_Parser::by_state> *)&local_60->_vptr_MC_Driver)->super_by_state).
         state != '\0') {
    if ((((((basic_symbol<MC::MC_Parser::by_state> *)&local_60->_vptr_MC_Driver)->super_by_state).
          state == '%') &&
        (((basic_symbol<MC::MC_Parser::by_state> *)&local_60->_vptr_MC_Driver)->field_0x1 == 's'))
       && ((long)yyp < (long)yyformat._4_4_)) {
      psVar1 = &local_38 + (long)yyp;
      yyp = yyp + 1;
      symbol_name_abi_cxx11_((MC_Parser *)&stack0xffffffffffffff80,*psVar1);
      std::__cxx11::string::operator+=((string *)this,(string *)&stack0xffffffffffffff80);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
      local_60 = (MC_Driver *)
                 &((basic_symbol<MC::MC_Parser::by_state> *)&local_60->_vptr_MC_Driver)->field_0x1;
    }
    else {
      std::__cxx11::string::operator+=
                ((string *)this,
                 (((basic_symbol<MC::MC_Parser::by_state> *)&local_60->_vptr_MC_Driver)->
                 super_by_state).state);
    }
    local_60 = (MC_Driver *)
               &((basic_symbol<MC::MC_Parser::by_state> *)&local_60->_vptr_MC_Driver)->field_0x1;
  }
  return this;
}

Assistant:

std::string
  MC_Parser::yysyntax_error_ (const context& yyctx) const
  {
    // Its maximum.
    enum { YYARGS_MAX = 5 };
    // Arguments of yyformat.
    symbol_kind_type yyarg[YYARGS_MAX];
    int yycount = yy_syntax_error_arguments_ (yyctx, yyarg, YYARGS_MAX);

    char const* yyformat = YY_NULLPTR;
    switch (yycount)
      {
#define YYCASE_(N, S)                         \
        case N:                               \
          yyformat = S;                       \
        break
      default: // Avoid compiler warnings.
        YYCASE_ (0, YY_("syntax error"));
        YYCASE_ (1, YY_("syntax error, unexpected %s"));
        YYCASE_ (2, YY_("syntax error, unexpected %s, expecting %s"));
        YYCASE_ (3, YY_("syntax error, unexpected %s, expecting %s or %s"));
        YYCASE_ (4, YY_("syntax error, unexpected %s, expecting %s or %s or %s"));
        YYCASE_ (5, YY_("syntax error, unexpected %s, expecting %s or %s or %s or %s"));
#undef YYCASE_
      }

    std::string yyres;
    // Argument number.
    std::ptrdiff_t yyi = 0;
    for (char const* yyp = yyformat; *yyp; ++yyp)
      if (yyp[0] == '%' && yyp[1] == 's' && yyi < yycount)
        {
          yyres += symbol_name (yyarg[yyi++]);
          ++yyp;
        }
      else
        yyres += *yyp;
    return yyres;
  }